

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can.c
# Opt level: O0

int csp_can2_rx(csp_iface_t *iface,uint32_t id,uint8_t *data,uint8_t dlc,int *task_woken)

{
  undefined1 in_CL;
  csp_packet_t *in_RDX;
  uint in_ESI;
  uint16_t *in_RDI;
  int *in_R8;
  int fragment_counter;
  uint16_t first_two;
  csp_packet_t *packet;
  csp_can_interface_data_t *ifdata;
  uint in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  __uint16_t in_stack_ffffffffffffffbe;
  csp_packet_t *local_40;
  int *task_woken_00;
  int buf_free;
  undefined4 in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffdc;
  uint32_t id_00;
  byte bVar1;
  int local_4;
  
  id_00 = CONCAT13(in_CL,in_stack_ffffffffffffffdc);
  task_woken_00 = *(int **)(in_RDI + 8);
  local_40 = csp_can_pbuf_find((csp_can_interface_data_t *)CONCAT44(id_00,in_stack_ffffffffffffffd8)
                               ,(uint32_t)((ulong)in_R8 >> 0x20),(uint32_t)in_R8,task_woken_00);
  if (local_40 == (csp_packet_t *)0x0) {
    if ((in_ESI & 2) == 0) {
      *(int *)(in_RDI + 0x22) = *(int *)(in_RDI + 0x22) + 1;
      return -2;
    }
    local_40 = csp_can_pbuf_new((csp_can_interface_data_t *)in_RDX,id_00,in_R8);
  }
  buf_free = (int)((ulong)in_R8 >> 0x20);
  if ((in_ESI & 2) == 0) {
    in_stack_ffffffffffffffb8 = in_ESI >> 2 & 7;
    if (local_40->rx_count != in_stack_ffffffffffffffb8) {
      csp_dbg_can_errno = '\x01';
      csp_can_pbuf_free((csp_can_interface_data_t *)in_RDX,
                        (csp_packet_t *)CONCAT44(id_00,in_stack_ffffffffffffffd8),buf_free,
                        task_woken_00);
      *(int *)(in_RDI + 0x22) = *(int *)(in_RDI + 0x22) + 1;
      return -2;
    }
    local_40->rx_count = local_40->rx_count + 1 & 7;
  }
  else {
    if ((byte)(id_00 >> 0x18) < 4) {
      csp_dbg_can_errno = '\x04';
      *(int *)(in_RDI + 0x22) = *(int *)(in_RDI + 0x22) + 1;
      csp_can_pbuf_free((csp_can_interface_data_t *)in_RDX,
                        (csp_packet_t *)CONCAT44(id_00,in_stack_ffffffffffffffd8),buf_free,
                        task_woken_00);
      return -2;
    }
    csp_id_setup_rx((csp_packet_t *)
                    CONCAT26(in_stack_ffffffffffffffbe,
                             CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)));
    in_stack_ffffffffffffffbe = __bswap_16((__uint16_t)(in_ESI >> 0xd));
    *(__uint16_t *)local_40->frame_begin = in_stack_ffffffffffffffbe;
    *(uint32_t *)(local_40->frame_begin + 2) = in_RDX->timestamp_tx;
    local_40->frame_length = 6;
    local_40->length = 0;
    in_RDX = (csp_packet_t *)&in_RDX->field_0x4;
    id_00 = CONCAT13((char)(id_00 >> 0x18) + -4,(int3)id_00);
    local_40->rx_count = 1;
  }
  bVar1 = (byte)(id_00 >> 0x18);
  if (local_40 + 1 <
      (csp_packet_t *)
      (local_40->frame_begin + (long)(int)(uint)bVar1 + (ulong)local_40->frame_length)) {
    csp_dbg_can_errno = '\x02';
    *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
    csp_can_pbuf_free((csp_can_interface_data_t *)in_RDX,
                      (csp_packet_t *)CONCAT44(id_00,in_stack_ffffffffffffffd8),
                      (int)((ulong)in_R8 >> 0x20),task_woken_00);
    local_4 = -2;
  }
  else {
    memcpy(local_40->frame_begin + local_40->frame_length,in_RDX,(ulong)bVar1);
    local_40->frame_length = local_40->frame_length + (ushort)(byte)(id_00 >> 0x18);
    if ((in_ESI & 1) != 0) {
      csp_id_strip((csp_packet_t *)
                   CONCAT26(in_stack_ffffffffffffffbe,
                            CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)));
      if ((local_40->id).dst == 0x3fff) {
        (local_40->id).dst = *in_RDI;
      }
      csp_can_pbuf_free((csp_can_interface_data_t *)in_RDX,
                        (csp_packet_t *)CONCAT44(id_00,in_stack_ffffffffffffffd8),
                        (int)((ulong)in_R8 >> 0x20),task_woken_00);
      csp_qfifo_write(in_RDX,(csp_iface_t *)CONCAT44(id_00,in_stack_ffffffffffffffd8),in_R8);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int csp_can2_rx(csp_iface_t * iface, uint32_t id, const uint8_t * data, uint8_t dlc, int * task_woken) {

	csp_can_interface_data_t * ifdata = iface->interface_data;

	/* Bind incoming frame to a packet buffer */
	csp_packet_t * packet = csp_can_pbuf_find(ifdata, id, CFP2_ID_CONN_MASK, task_woken);
	if (packet == NULL) {
		if (id & (CFP2_BEGIN_MASK << CFP2_BEGIN_OFFSET)) {
			packet = csp_can_pbuf_new(ifdata, id, task_woken);
		} else {
			iface->frame++;
			return CSP_ERR_INVAL;
		}
	}


	/* BEGIN */
	if (id & (CFP2_BEGIN_MASK << CFP2_BEGIN_OFFSET)) {

		/* Discard packet if DLC is less than CSP id + CSP length fields */
		if (dlc < 4) {
			csp_dbg_can_errno = CSP_DBG_CAN_ERR_SHORT_BEGIN;
			iface->frame++;
			csp_can_pbuf_free(ifdata, packet, 1, task_woken);
			return CSP_ERR_INVAL;
		}

		csp_id_setup_rx(packet);

		/* Copy first 2 bytes from CFP 2.0 header:
		 * Because the id field has already been converted in memory to a 32-bit
		 * host-order field, extract the first two bytes and convert back to
		 * network order */
		uint16_t first_two = id >> CFP2_DST_OFFSET;
		first_two = htobe16(first_two);
		memcpy(packet->frame_begin, &first_two, 2);

		/* Copy next 4 from data, the data field is in network order */
		memcpy(&packet->frame_begin[2], data, 4);

		packet->frame_length = 6;
		packet->length = 0;

		/* Move RX offset for incoming data */
		data += 4;
		dlc -= 4;

		/* Set next expected fragment counter to be 1 */
		packet->rx_count = 1;

		/* FRAGMENT */
	} else {

		int fragment_counter = (id >> CFP2_FC_OFFSET) & CFP2_FC_MASK;

		/* Check fragment counter is increasing:
		 * We abuse / reuse the rx_count pbuf field
		 * (Note this could be done using csp buffers instead) */
		if ((packet->rx_count) != fragment_counter) {
			csp_dbg_can_errno = CSP_DBG_CAN_ERR_FRAME_LOST;
			csp_can_pbuf_free(ifdata, packet, 1, task_woken);
			iface->frame++;
			return CSP_ERR_INVAL;
		}

		/* Increment expected next fragment counter:
		 * and with the mask in order to wrap around */
		packet->rx_count = (packet->rx_count + 1) & CFP2_FC_MASK;
	}

	/* Check for overflow. The frame input + dlc must not exceed the end of the packet data field */
	if (&packet->frame_begin[packet->frame_length] + dlc > &packet->data[sizeof(packet->data)]) {
		csp_dbg_can_errno = CSP_DBG_CAN_ERR_RX_OVF;
		iface->rx_error++;
		csp_can_pbuf_free(ifdata, packet, 1, task_woken);
		return CSP_ERR_INVAL;
	}

	/* Copy dlc bytes into buffer */
	memcpy(&packet->frame_begin[packet->frame_length], data, dlc);
	packet->frame_length += dlc;

	/* END */
	if (id & (CFP2_END_MASK << CFP2_END_OFFSET)) {

		/* Parse CSP header into csp_id type */
		csp_id_strip(packet);

		/* Rewrite incoming L2 broadcast to local node */
		if (packet->id.dst == 0x3FFF) {
			packet->id.dst = iface->addr;
		}

		/* Free packet buffer */
		csp_can_pbuf_free(ifdata, packet, 0, task_woken);

		/* Data is available */
		csp_qfifo_write(packet, iface, task_woken);

	}

	return CSP_ERR_NONE;
}